

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

bignum __thiscall jbcoin::generateRootDeterministicKey(jbcoin *this,uint128 *seed)

{
  undefined4 v;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  iterator pvVar2;
  pointer dest;
  size_type bytes;
  pointer pvVar3;
  size_t sVar4;
  array<unsigned_char,_20UL> *args;
  bool local_aa;
  undefined1 local_64 [8];
  result_type root;
  undefined1 local_34 [8];
  array<unsigned_char,_20UL> buf;
  uint32_t seq;
  uint128 *seed_local;
  bignum *privKey;
  
  buf._M_elems[0x13] = '\0';
  openssl::bignum::bignum((bignum *)this);
  buf._M_elems[0xc] = '\0';
  buf._M_elems[0xd] = '\0';
  buf._M_elems[0xe] = '\0';
  buf._M_elems[0xf] = '\0';
  do {
    __first = base_uint<128UL,_void>::begin(seed);
    __last = base_uint<128UL,_void>::end(seed);
    pvVar2 = std::array<unsigned_char,_20UL>::begin((array<unsigned_char,_20UL> *)local_34);
    std::copy<unsigned_char_const*,unsigned_char*>(__first,__last,pvVar2);
    pvVar2 = std::array<unsigned_char,_20UL>::begin((array<unsigned_char,_20UL> *)local_34);
    v = buf._M_elems._12_4_;
    buf._M_elems._12_4_ = buf._M_elems._12_4_ + 1;
    copy_uint32<unsigned_char*>(pvVar2 + 0x10,v);
    sha512Half<std::array<unsigned_char,20ul>>((result_type *)local_64,(jbcoin *)local_34,args);
    dest = std::array<unsigned_char,_20UL>::data((array<unsigned_char,_20UL> *)local_34);
    bytes = std::array<unsigned_char,_20UL>::size((array<unsigned_char,_20UL> *)local_34);
    beast::secure_erase<void>(dest,bytes);
    pvVar3 = base_uint<256UL,_void>::data((base_uint<256UL,_void> *)local_64);
    sVar4 = base_uint<256UL,_void>::size();
    openssl::bignum::assign((bignum *)this,pvVar3,sVar4);
    pvVar3 = base_uint<256UL,_void>::data((base_uint<256UL,_void> *)local_64);
    sVar4 = base_uint<256UL,_void>::size();
    beast::secure_erase<void>(pvVar3,sVar4);
    bVar1 = openssl::bignum::is_zero((bignum *)this);
    local_aa = true;
    if (!bVar1) {
      local_aa = openssl::operator>=((bignum *)this,(bignum *)&DAT_00527e10);
    }
  } while (local_aa != false);
  beast::secure_erase<void>(buf._M_elems + 0xc,4);
  return (bignum)(BIGNUM *)this;
}

Assistant:

static bignum generateRootDeterministicKey (uint128 const& seed)
{
    // find non-zero private key less than the curve's order
    bignum privKey;
    std::uint32_t seq = 0;

    do
    {
        // buf: 0                seed               16  seq  20
        //      |<--------------------------------->|<------>|
        std::array<std::uint8_t, 20> buf;
        std::copy(seed.begin(), seed.end(), buf.begin());
        copy_uint32 (buf.begin() + 16, seq++);
        auto root = sha512Half(buf);
        beast::secure_erase(buf.data(), buf.size());
        privKey.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (privKey.is_zero() || privKey >= secp256k1curve.order);
    beast::secure_erase(&seq, sizeof(seq));
    return privKey;
}